

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

void __thiscall FileInputSource::setFilename(FileInputSource *this,char *filename)

{
  FILE *pFVar1;
  char *filename_local;
  FileInputSource *this_local;
  
  this->close_file = true;
  std::__cxx11::string::operator=((string *)&this->filename,filename);
  pFVar1 = QUtil::safe_fopen(filename,"rb");
  this->file = pFVar1;
  return;
}

Assistant:

void
FileInputSource::setFilename(char const* filename)
{
    this->close_file = true;
    this->filename = filename;
    this->file = QUtil::safe_fopen(filename, "rb");
}